

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void iterator_extreme_key_test(void)

{
  uint uVar1;
  fdb_status fVar2;
  int iVar3;
  fdb_status s;
  fdb_iterator *fit;
  fdb_doc *doc;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char valueBuf [256];
  char keyBuf [256];
  char value [256];
  char key [256];
  char cmd [256];
  int c;
  int r;
  int i;
  int n;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffff828;
  ulong uVar4;
  fdb_iterator *pfVar5;
  fdb_kvs_handle *in_stack_fffffffffffff830;
  fdb_iterator *in_stack_fffffffffffff838;
  fdb_iterator *in_stack_fffffffffffff840;
  fdb_doc **in_stack_fffffffffffff848;
  void *in_stack_fffffffffffff850;
  size_t in_stack_fffffffffffff858;
  void *in_stack_fffffffffffff860;
  fdb_kvs_handle *in_stack_fffffffffffff868;
  fdb_doc **in_stack_fffffffffffff8a0;
  fdb_iterator *in_stack_fffffffffffff8a8;
  fdb_status local_69c;
  fdb_iterator *local_698;
  long local_690;
  undefined1 local_670 [64];
  fdb_kvs_config *in_stack_fffffffffffff9d0;
  char *in_stack_fffffffffffff9d8;
  fdb_kvs_handle **in_stack_fffffffffffff9e0;
  fdb_file_handle *in_stack_fffffffffffff9e8;
  fdb_config *in_stack_fffffffffffffa48;
  char *in_stack_fffffffffffffa50;
  fdb_file_handle **in_stack_fffffffffffffa58;
  fdb_kvs_handle *local_578;
  undefined1 local_568 [256];
  undefined1 local_468 [256];
  fdb_doc *local_368 [32];
  fdb_iterator local_268;
  char local_168 [264];
  uint local_60;
  int local_5c;
  uint local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_54 = 0x1e;
  local_690 = 0;
  sprintf(local_168,"rm -rf  iterator_test*");
  local_5c = system(local_168);
  memleak_start();
  fdb_get_default_config();
  memcpy(local_670,&stack0xfffffffffffff868,0xf8);
  fdb_get_default_kvs_config();
  fVar2 = fdb_open(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x596);
    iterator_extreme_key_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x596,"void iterator_extreme_key_test()");
    }
  }
  fVar2 = fdb_kvs_open(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8
                       ,in_stack_fffffffffffff9d0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x598);
    iterator_extreme_key_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x598,"void iterator_extreme_key_test()");
    }
  }
  memset(&local_268,0xff,0x100);
  for (local_58 = 1; (int)local_58 < (int)local_54; local_58 = local_58 + 1) {
    sprintf((char *)local_368,"0xff length %d",(ulong)local_58);
    in_stack_fffffffffffff838 = &local_268;
    in_stack_fffffffffffff840 = (fdb_iterator *)(long)(int)local_58;
    in_stack_fffffffffffff848 = local_368;
    in_stack_fffffffffffff830 = local_578;
    strlen((char *)local_368);
    fdb_set_kv(in_stack_fffffffffffff868,in_stack_fffffffffffff860,in_stack_fffffffffffff858,
               in_stack_fffffffffffff850,(size_t)in_stack_fffffffffffff848);
  }
  fdb_commit(in_stack_fffffffffffff828,'\0');
  uVar4 = 0;
  fVar2 = fdb_doc_create(in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                         (size_t)in_stack_fffffffffffff838,in_stack_fffffffffffff830,0,
                         (void *)0x10f467,(size_t)in_stack_fffffffffffff860);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5a3);
    iterator_extreme_key_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5a3,"void iterator_extreme_key_test()");
    }
  }
  *(undefined1 **)(local_690 + 0x20) = local_468;
  *(undefined8 *)(local_690 + 0x38) = 0;
  *(undefined1 **)(local_690 + 0x40) = local_568;
  pfVar5 = (fdb_iterator *)(uVar4 & 0xffffffff00000000);
  fVar2 = fdb_iterator_init(local_578,&local_698,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5a9);
    iterator_extreme_key_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5a9,"void iterator_extreme_key_test()");
    }
  }
  local_69c = fdb_iterator_seek_to_max(pfVar5);
  local_60 = local_54;
  if (local_69c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5ab);
    iterator_extreme_key_test::__test_pass = 0;
    local_60 = local_54;
    if (local_69c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5ab,"void iterator_extreme_key_test()");
    }
  }
  while ((local_60 = local_60 - 1, local_69c == FDB_RESULT_SUCCESS &&
         (fVar2 = fdb_iterator_get(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0),
         fVar2 == FDB_RESULT_SUCCESS))) {
    sprintf((char *)local_368,"0xff length %d",(ulong)local_60);
    iVar3 = memcmp(*(void **)(local_690 + 0x40),local_368,*(size_t *)(local_690 + 0x10));
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_368,
              *(undefined8 *)(local_690 + 0x40),
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x5b3);
      iterator_extreme_key_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5b3,"void iterator_extreme_key_test()");
    }
    local_69c = fdb_iterator_prev(pfVar5);
  }
  local_58 = 8;
  local_60 = 8;
  local_69c = fdb_iterator_seek(in_stack_fffffffffffff840,in_stack_fffffffffffff838,
                                (size_t)in_stack_fffffffffffff830,
                                (fdb_iterator_seek_opt_t)((ulong)pfVar5 >> 0x38));
  while ((local_69c == FDB_RESULT_SUCCESS &&
         (fVar2 = fdb_iterator_get(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0),
         fVar2 == FDB_RESULT_SUCCESS))) {
    sprintf((char *)local_368,"0xff length %d",(ulong)local_60);
    iVar3 = memcmp(*(void **)(local_690 + 0x40),local_368,*(size_t *)(local_690 + 0x10));
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_368,
              *(undefined8 *)(local_690 + 0x40),
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x5c1);
      iterator_extreme_key_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5c1,"void iterator_extreme_key_test()");
    }
    local_69c = fdb_iterator_prev(pfVar5);
    local_60 = local_60 - 1;
  }
  local_58 = 8;
  local_60 = 8;
  local_69c = fdb_iterator_seek(in_stack_fffffffffffff840,in_stack_fffffffffffff838,
                                (size_t)in_stack_fffffffffffff830,
                                (fdb_iterator_seek_opt_t)((ulong)pfVar5 >> 0x38));
  while ((local_69c == FDB_RESULT_SUCCESS &&
         (fVar2 = fdb_iterator_get(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0),
         fVar2 == FDB_RESULT_SUCCESS))) {
    sprintf((char *)local_368,"0xff length %d",(ulong)local_60);
    iVar3 = memcmp(*(void **)(local_690 + 0x40),local_368,*(size_t *)(local_690 + 0x10));
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_368,
              *(undefined8 *)(local_690 + 0x40),
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x5cf);
      iterator_extreme_key_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5cf,"void iterator_extreme_key_test()");
    }
    local_69c = fdb_iterator_next(pfVar5);
    local_60 = local_60 + 1;
  }
  fVar2 = fdb_iterator_close(in_stack_fffffffffffff838);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5d5);
    iterator_extreme_key_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5d5,"void iterator_extreme_key_test()");
    }
  }
  pfVar5 = (fdb_iterator *)((ulong)pfVar5 & 0xffffffff00000000);
  fVar2 = fdb_iterator_init(local_578,&local_698,(void *)0x0,0,&local_268,0x100,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5d9);
    iterator_extreme_key_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5d9,"void iterator_extreme_key_test()");
    }
  }
  local_69c = fdb_iterator_seek_to_max(pfVar5);
  uVar1 = local_54;
  if (local_69c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5db);
    iterator_extreme_key_test::__test_pass = 0;
    uVar1 = local_54;
    if (local_69c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5db,"void iterator_extreme_key_test()");
    }
  }
  while ((local_60 = uVar1 - 1, local_69c == FDB_RESULT_SUCCESS &&
         (fVar2 = fdb_iterator_get(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0),
         fVar2 == FDB_RESULT_SUCCESS))) {
    sprintf((char *)local_368,"0xff length %d",(ulong)local_60);
    iVar3 = memcmp(*(void **)(local_690 + 0x40),local_368,*(size_t *)(local_690 + 0x10));
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_368,
              *(undefined8 *)(local_690 + 0x40),
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x5e4);
      iterator_extreme_key_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5e4,"void iterator_extreme_key_test()");
    }
    local_69c = fdb_iterator_prev(pfVar5);
    uVar1 = local_60;
  }
  fVar2 = fdb_iterator_close(in_stack_fffffffffffff838);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5ea);
    iterator_extreme_key_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5ea,"void iterator_extreme_key_test()");
    }
  }
  fVar2 = fdb_close((fdb_file_handle *)pfVar5);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5ec);
    iterator_extreme_key_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5ec,"void iterator_extreme_key_test()");
    }
  }
  *(undefined8 *)(local_690 + 0x20) = 0;
  *(undefined8 *)(local_690 + 0x40) = 0;
  fVar2 = fdb_doc_free((fdb_doc *)0x10fda2);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5f2);
    iterator_extreme_key_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5f2,"void iterator_extreme_key_test()");
    }
  }
  fVar2 = fdb_shutdown();
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5f5);
    iterator_extreme_key_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5f5,"void iterator_extreme_key_test()");
    }
  }
  memleak_end();
  if (iterator_extreme_key_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","iterator extreme key test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","iterator extreme key test");
  }
  return;
}

Assistant:

void iterator_extreme_key_test()
{
    TEST_INIT();

    int n = 30;
    int i, r, c;
    char cmd[256];
    char key[256], value[256];
    char keyBuf[256], valueBuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc = NULL;
    fdb_iterator *fit;
    fdb_status s;

    sprintf(cmd, SHELL_DEL " iterator_test*");
    r = system(cmd);
    (void)r;

    memleak_start();

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    s = fdb_open(&dbfile, "./iterator_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memset(key, 0xff, 256);
    for (i=1;i<n;i+=1){
        sprintf(value, "0xff length %d", (int)i);
        fdb_set_kv(db, key, i, value, strlen(value)+1);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // Pre-allocate iterator return document memory and re-use the same
    s = fdb_doc_create(&doc, NULL, 0, NULL, 0, NULL, 0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    doc->key = &keyBuf[0];
    doc->meta = NULL;
    doc->body = &valueBuf[0];

    s = fdb_iterator_init(db, &fit, NULL, 0, NULL, 0, 0x0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_iterator_seek_to_max(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    c = n-1;
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_prev(fit);
        c--;
    }

    i = 8;
    c = i;
    s = fdb_iterator_seek(fit, key, i, FDB_ITR_SEEK_LOWER);
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_prev(fit);
        c--;
    }

    i = 8;
    c = i;
    s = fdb_iterator_seek(fit, key, i, FDB_ITR_SEEK_LOWER);
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_next(fit);
        c++;
    }

    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // Initialize iterator to an extreme non-existent end_key
    s = fdb_iterator_init(db, &fit, NULL, 0, key, 256, 0x0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_iterator_seek_to_max(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    c = n-1;
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_prev(fit);
        c--;
    }

    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // Release pre-allocated iterator return document buffer space
    doc->key = NULL;
    doc->body = NULL;
    s = fdb_doc_free(doc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    memleak_end();
    TEST_RESULT("iterator extreme key test");
}